

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::~ProcessGroup
          (ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *this)

{
  __pointer_type this_00;
  Semaphore *in_RDI;
  string *cur;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffe8;
  __pointer_type this_01;
  
  this_00 = std::
            atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            ::load(in_stack_ffffffffffffffe8,(memory_order)((ulong)in_RDI >> 0x20));
  this_01 = this_00;
  if (this_00 != (__pointer_type)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
  ::~vector((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
             *)this_01);
  IlmThread_3_4::Semaphore::~Semaphore(in_RDI);
  return;
}

Assistant:

~ProcessGroup()
    {
        std::string *cur = _first_failure.load ();
        delete cur;
    }